

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int outfile(char *filename,int rgb_dir,int vdir,int x,int y,int comp,void *data,int alpha,int pad,
           char *fmt,...)

{
  byte bVar1;
  byte bVar3;
  char in_AL;
  FILE *__stream;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  void *pvVar13;
  void *pvVar14;
  bool bVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined1 local_98 [8];
  va_list v;
  undefined4 local_40;
  uint local_3c;
  uint32 zero;
  byte local_33 [8];
  uint8 px [3];
  byte bVar2;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  __stream = fopen(filename,"wb");
  if (__stream != (FILE *)0x0) {
    v[0].overflow_arg_area = local_148;
    v[0]._0_8_ = &stack0x00000028;
    local_98._0_4_ = 0x30;
    local_98._4_4_ = 0x30;
    writefv((FILE *)__stream,fmt,(__va_list_tag *)local_98);
    local_40 = 0;
    lVar11 = (long)comp;
    uVar4 = 0;
    if (0 < x) {
      uVar4 = (ulong)(uint)x;
    }
    lVar5 = (long)y;
    lVar6 = lVar11 * x;
    pvVar13 = (void *)((lVar5 + -1) * lVar6 + (long)data);
    local_3c = comp - 1;
    zero = comp;
    while (bVar15 = lVar5 != 0, lVar5 = lVar5 + -1, bVar15) {
      pvVar14 = pvVar13;
      for (uVar8 = 0; uVar8 != uVar4; uVar8 = uVar8 + 1) {
        pbVar12 = (byte *)((uVar8 + lVar5 * x) * lVar11 + (long)data);
        if (local_3c < 2) {
          bVar3 = *pbVar12;
          uVar7 = (ulong)(uint)bVar3;
          uVar10 = (ulong)(uint)bVar3;
LAB_001e4678:
          writef((FILE *)__stream,fmt,uVar7,(ulong)bVar3,uVar10);
        }
        else {
          if (zero == 3) {
LAB_001e4657:
            bVar3 = pbVar12[1];
            bVar1 = pbVar12[2];
            bVar2 = *pbVar12;
LAB_001e4666:
            uVar10 = (ulong)bVar2;
            uVar7 = (ulong)bVar1;
            goto LAB_001e4678;
          }
          if (zero == 4) {
            if (alpha != 0) goto LAB_001e4657;
            bVar3 = pbVar12[3];
            for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
              local_33[lVar9] =
                   (char)((int)(((uint)*(byte *)((long)pvVar14 + lVar9) -
                                (uint)(byte)(&DAT_0024eb65)[lVar9]) * (uint)bVar3) / 0xff) +
                   (&DAT_0024eb65)[lVar9];
            }
            fmt = (char *)0x3;
            bVar3 = local_33[1];
            bVar1 = local_33[2];
            bVar2 = local_33[0];
            goto LAB_001e4666;
          }
        }
        if (0 < alpha) {
          fmt = (char *)__stream;
          fputc((int)(char)pbVar12[lVar11 + -1],__stream);
        }
        pvVar14 = (void *)((long)pvVar14 + lVar11);
      }
      fmt = (char *)(ulong)(uint)pad;
      fwrite(&local_40,(size_t)(ulong)(uint)pad,1,__stream);
      pvVar13 = (void *)((long)pvVar13 - lVar6);
    }
    fclose(__stream);
  }
  return (int)(__stream != (FILE *)0x0);
}

Assistant:

static int outfile(char const *filename, int rgb_dir, int vdir, int x, int y, int comp, void *data, int alpha, int pad, char *fmt, ...)
{
   FILE *f = fopen(filename, "wb");
   if (f) {
      va_list v;
      va_start(v, fmt);
      writefv(f, fmt, v);
      va_end(v);
      write_pixels(f,rgb_dir,vdir,x,y,comp,data,alpha,pad);
      fclose(f);
   }
   return f != NULL;
}